

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O3

void __thiscall
Assimp::AssbinImporter::ReadBinaryMaterial(AssbinImporter *this,IOStream *stream,aiMaterial *mat)

{
  uint uVar1;
  aiMaterialProperty **ppaVar2;
  aiMaterialProperty *paVar3;
  runtime_error *this_00;
  AssbinImporter *this_01;
  ulong uVar4;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  uVar1 = Read<unsigned_int>(stream);
  if (uVar1 != 0x123d) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"Magic chunk identifiers are wrong!","");
    std::runtime_error::runtime_error(this_00,(string *)local_48);
    *(undefined ***)this_00 = &PTR__runtime_error_007fc4b8;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  Read<unsigned_int>(stream);
  uVar1 = Read<unsigned_int>(stream);
  mat->mNumProperties = uVar1;
  mat->mNumAllocated = uVar1;
  if (uVar1 != 0) {
    if (mat->mProperties != (aiMaterialProperty **)0x0) {
      operator_delete__(mat->mProperties);
      uVar1 = mat->mNumProperties;
    }
    ppaVar2 = (aiMaterialProperty **)operator_new__((ulong)uVar1 << 3);
    mat->mProperties = ppaVar2;
    if (uVar1 != 0) {
      uVar4 = 0;
      do {
        paVar3 = (aiMaterialProperty *)operator_new(0x420);
        (paVar3->mKey).length = 0;
        (paVar3->mKey).data[0] = '\0';
        this_01 = (AssbinImporter *)((paVar3->mKey).data + 1);
        memset(this_01,0x1b,0x3ff);
        paVar3->mSemantic = 0;
        paVar3->mIndex = 0;
        paVar3->mDataLength = 0;
        paVar3->mType = aiPTI_Float;
        paVar3->mData = (char *)0x0;
        mat->mProperties[uVar4] = paVar3;
        ReadBinaryMaterialProperty(this_01,stream,mat->mProperties[uVar4]);
        uVar4 = uVar4 + 1;
      } while (uVar4 < mat->mNumProperties);
    }
  }
  return;
}

Assistant:

void AssbinImporter::ReadBinaryMaterial(IOStream * stream, aiMaterial* mat) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AIMATERIAL)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    mat->mNumAllocated = mat->mNumProperties = Read<unsigned int>(stream);
    if (mat->mNumProperties)
    {
        if (mat->mProperties)
        {
            delete[] mat->mProperties;
        }
        mat->mProperties = new aiMaterialProperty*[mat->mNumProperties];
        for (unsigned int i = 0; i < mat->mNumProperties;++i) {
            mat->mProperties[i] = new aiMaterialProperty();
            ReadBinaryMaterialProperty( stream, mat->mProperties[i]);
        }
    }
}